

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

MaxBroadcastableLayerParams * __thiscall
CoreML::Specification::MaxBroadcastableLayerParams::New
          (MaxBroadcastableLayerParams *this,Arena *arena)

{
  MaxBroadcastableLayerParams *this_00;
  
  this_00 = (MaxBroadcastableLayerParams *)operator_new(0x18);
  MaxBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::MaxBroadcastableLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

MaxBroadcastableLayerParams* MaxBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  MaxBroadcastableLayerParams* n = new MaxBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}